

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O3

CollationElementIterator * __thiscall
icu_63::CollationElementIterator::operator=
          (CollationElementIterator *this,CollationElementIterator *other)

{
  ushort uVar1;
  CollationIterator *pCVar2;
  uint in_EAX;
  FCDUTF16CollationIterator *other_00;
  FCDUTF16CollationIterator *this_00;
  UTF16CollationIterator *other_01;
  UVector32 *this_01;
  char16_t *pcVar3;
  pointer_____offset_0x10___ *ppuVar4;
  UVector32 *other_02;
  UErrorCode errorCode;
  undefined8 uStack_28;
  
  if (this == other) {
    return this;
  }
  pCVar2 = other->iter_;
  uStack_28._0_4_ = in_EAX;
  if (pCVar2 != (CollationIterator *)0x0) {
    ppuVar4 = &CollationIterator::typeinfo;
    other_00 = (FCDUTF16CollationIterator *)
               __dynamic_cast(pCVar2,&CollationIterator::typeinfo,
                              &FCDUTF16CollationIterator::typeinfo,0);
    if (other_00 == (FCDUTF16CollationIterator *)0x0) {
      ppuVar4 = &CollationIterator::typeinfo;
      other_01 = (UTF16CollationIterator *)
                 __dynamic_cast(pCVar2,&CollationIterator::typeinfo,
                                &UTF16CollationIterator::typeinfo,0);
      if ((other_01 == (UTF16CollationIterator *)0x0) ||
         (this_00 = (FCDUTF16CollationIterator *)
                    UMemory::operator_new((UMemory *)0x1a0,(size_t)ppuVar4),
         this_00 == (FCDUTF16CollationIterator *)0x0)) goto LAB_00228c04;
      uVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          pcVar3 = (this->string_).fUnion.fFields.fArray;
        }
        else {
          pcVar3 = (this->string_).fUnion.fStackFields.fBuffer;
        }
      }
      else {
        pcVar3 = (char16_t *)0x0;
      }
      UTF16CollationIterator::UTF16CollationIterator
                ((UTF16CollationIterator *)this_00,other_01,pcVar3);
    }
    else {
      this_00 = (FCDUTF16CollationIterator *)UMemory::operator_new((UMemory *)0x210,(size_t)ppuVar4)
      ;
      if (this_00 == (FCDUTF16CollationIterator *)0x0) goto LAB_00228c04;
      uVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          pcVar3 = (this->string_).fUnion.fFields.fArray;
        }
        else {
          pcVar3 = (this->string_).fUnion.fStackFields.fBuffer;
        }
      }
      else {
        pcVar3 = (char16_t *)0x0;
      }
      FCDUTF16CollationIterator::FCDUTF16CollationIterator(this_00,other_00,pcVar3);
    }
    if (this->iter_ != (CollationIterator *)0x0) {
      (*(this->iter_->super_UObject)._vptr_UObject[1])();
    }
    this->iter_ = (CollationIterator *)this_00;
    this->rbc_ = other->rbc_;
    this->otherHalf_ = other->otherHalf_;
    this->dir_ = other->dir_;
    UnicodeString::operator=(&this->string_,&other->string_);
  }
LAB_00228c04:
  if (((other->dir_ < '\0') && (other_02 = other->offsets_, other_02 != (UVector32 *)0x0)) &&
     (other_02->count != 0)) {
    uStack_28 = (ulong)(uint)uStack_28;
    this_01 = this->offsets_;
    if (this_01 == (UVector32 *)0x0) {
      this_01 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)other_02);
      if (this_01 == (UVector32 *)0x0) {
        this->offsets_ = (UVector32 *)0x0;
        return this;
      }
      UVector32::UVector32(this_01,other->offsets_->count,(UErrorCode *)((long)&uStack_28 + 4));
      this->offsets_ = this_01;
      other_02 = other->offsets_;
    }
    UVector32::assign(this_01,other_02,(UErrorCode *)((long)&uStack_28 + 4));
  }
  return this;
}

Assistant:

const CollationElementIterator& CollationElementIterator::operator=(
                                         const CollationElementIterator& other)
{
    if (this == &other) {
        return *this;
    }

    CollationIterator *newIter;
    const FCDUTF16CollationIterator *otherFCDIter =
            dynamic_cast<const FCDUTF16CollationIterator *>(other.iter_);
    if(otherFCDIter != NULL) {
        newIter = new FCDUTF16CollationIterator(*otherFCDIter, string_.getBuffer());
    } else {
        const UTF16CollationIterator *otherIter =
                dynamic_cast<const UTF16CollationIterator *>(other.iter_);
        if(otherIter != NULL) {
            newIter = new UTF16CollationIterator(*otherIter, string_.getBuffer());
        } else {
            newIter = NULL;
        }
    }
    if(newIter != NULL) {
        delete iter_;
        iter_ = newIter;
        rbc_ = other.rbc_;
        otherHalf_ = other.otherHalf_;
        dir_ = other.dir_;

        string_ = other.string_;
    }
    if(other.dir_ < 0 && other.offsets_ != NULL && !other.offsets_->isEmpty()) {
        UErrorCode errorCode = U_ZERO_ERROR;
        if(offsets_ == NULL) {
            offsets_ = new UVector32(other.offsets_->size(), errorCode);
        }
        if(offsets_ != NULL) {
            offsets_->assign(*other.offsets_, errorCode);
        }
    }
    return *this;
}